

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O2

common_chat_params *
common_chat_templates_apply
          (common_chat_params *__return_storage_ptr__,common_chat_templates *tmpls,
          common_chat_templates_inputs *inputs)

{
  pointer pcVar1;
  pointer pcVar2;
  chat_template *pcVar3;
  pointer pbVar4;
  bool bVar5;
  uint uVar6;
  common_log *log;
  long lVar7;
  runtime_error *this;
  pointer pcVar8;
  int iVar9;
  common_chat_msg_content_part *part;
  pointer __lhs;
  long lVar10;
  long lVar11;
  size_t i;
  ulong uVar12;
  undefined1 auVar13 [16];
  vector<char,_std::allocator<char>_> buf;
  vector<llama_chat_message,_std::allocator<llama_chat_message>_> chat;
  string content;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  contents;
  json local_68;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (tmpls == (common_chat_templates *)0x0) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/chat.cpp"
               ,0x6c5,"GGML_ASSERT(%s) failed","tmpls != nullptr");
  }
  if (inputs->use_jinja == true) {
    common_chat_templates_apply_jinja(__return_storage_ptr__,tmpls,inputs);
  }
  else {
    chat.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    chat.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    chat.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    contents.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    contents.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    contents.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar1 = (inputs->messages).
             super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar8 = (inputs->messages).
                  super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar8 != pcVar1; pcVar8 = pcVar8 + 1) {
      std::__cxx11::string::string((string *)&content,(string *)&pcVar8->content);
      pcVar2 = (pcVar8->content_parts).
               super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (__lhs = (pcVar8->content_parts).
                   super__Vector_base<common_chat_msg_content_part,_std::allocator<common_chat_msg_content_part>_>
                   ._M_impl.super__Vector_impl_data._M_start; __lhs != pcVar2; __lhs = __lhs + 1) {
        bVar5 = std::operator!=(&__lhs->type,"text");
        if (bVar5) {
          if (-1 < common_log_verbosity_thold) {
            log = common_log_main();
            common_log_add(log,GGML_LOG_LEVEL_WARN,"Ignoring non-text content part: %s\n",
                           (__lhs->type)._M_dataplus._M_p);
          }
        }
        else {
          if (content._M_string_length != 0) {
            std::__cxx11::string::append((char *)&content);
          }
          std::__cxx11::string::append((string *)&content);
        }
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&contents,
                 &content);
      std::__cxx11::string::~string((string *)&content);
    }
    lVar10 = 8;
    iVar9 = 0;
    lVar11 = lVar10;
    for (uVar12 = 0;
        pbVar4 = contents.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar12 < (ulong)((long)contents.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)contents.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1)
    {
      pcVar8 = (inputs->messages).
               super__Vector_base<common_chat_msg,_std::allocator<common_chat_msg>_>._M_impl.
               super__Vector_impl_data._M_start;
      content._M_dataplus._M_p = *(pointer *)((long)pcVar8 + lVar10 + -8);
      content._M_string_length =
           *(size_type *)
            ((long)contents.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8);
      std::vector<llama_chat_message,_std::allocator<llama_chat_message>_>::
      emplace_back<llama_chat_message>(&chat,(llama_chat_message *)&content);
      lVar7 = *(long *)((long)&(pbVar4->_M_dataplus)._M_p + lVar11) +
              *(long *)((long)&(pcVar8->role)._M_dataplus + lVar10);
      auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar13._0_8_ = lVar7;
      auVar13._12_4_ = 0x45300000;
      iVar9 = (int)(((auVar13._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 1.25 +
                   (double)iVar9);
      lVar11 = lVar11 + 0x20;
      lVar10 = lVar10 + 0xd0;
    }
    std::vector<char,_std::allocator<char>_>::vector(&buf,(long)iVar9,(allocator_type *)&content);
    pcVar3 = (tmpls->template_default)._M_t.
             super___uniq_ptr_impl<minja::chat_template,_std::default_delete<minja::chat_template>_>
             ._M_t.
             super__Tuple_impl<0UL,_minja::chat_template_*,_std::default_delete<minja::chat_template>_>
             .super__Head_base<0UL,_minja::chat_template_*,_false>._M_head_impl;
    uVar6 = llama_chat_apply_template
                      ((pcVar3->source_)._M_dataplus._M_p,
                       chat.
                       super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)chat.
                             super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)chat.
                             super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4,
                       inputs->add_generation_prompt,
                       buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                       (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    if ((int)uVar6 < 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"this custom template is not supported");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((ulong)(CONCAT44(buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish._4_4_,
                         (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish) -
               (long)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start) < (ulong)uVar6) {
      std::vector<char,_std::allocator<char>_>::resize(&buf,(ulong)uVar6);
      uVar6 = llama_chat_apply_template
                        ((pcVar3->source_)._M_dataplus._M_p,
                         chat.
                         super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)chat.
                               super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)chat.
                               super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4,
                         inputs->add_generation_prompt,
                         buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start,
                         (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                         (int)buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    }
    common_chat_params::common_chat_params(__return_storage_ptr__);
    content._M_dataplus._M_p = (pointer)&content.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&content,
               buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,buf.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)uVar6);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->prompt,(string *)&content);
    std::__cxx11::string::~string((string *)&content);
    if ((inputs->json_schema)._M_string_length == 0) {
      std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->grammar);
    }
    else {
      local_58._M_unused._M_object = (void *)0x0;
      local_58._8_8_ = 0;
      local_48 = 0;
      uStack_40 = 0;
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::parse<std::__cxx11::string_const&>
                ((basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)&local_68,&inputs->json_schema,(parser_callback_t *)&local_58,true,false);
      json_schema_to_grammar(&content,&local_68,false);
      std::__cxx11::string::operator=((string *)&__return_storage_ptr__->grammar,(string *)&content)
      ;
      std::__cxx11::string::~string((string *)&content);
      nlohmann::json_abi_v3_11_3::
      basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::~basic_json(&local_68);
      std::_Function_base::~_Function_base((_Function_base *)&local_58);
    }
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              (&buf.super__Vector_base<char,_std::allocator<char>_>);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&contents);
    std::_Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>::~_Vector_base
              (&chat.super__Vector_base<llama_chat_message,_std::allocator<llama_chat_message>_>);
  }
  return __return_storage_ptr__;
}

Assistant:

common_chat_params common_chat_templates_apply(
    const struct common_chat_templates * tmpls,
    const struct common_chat_templates_inputs & inputs)
{
    GGML_ASSERT(tmpls != nullptr);
    return inputs.use_jinja
        ? common_chat_templates_apply_jinja(tmpls, inputs)
        : common_chat_templates_apply_legacy(tmpls, inputs);
}